

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

ulong rand_range(ulong rand_val,ulong range)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar2 = rand_val >> 0x10 & 0xffff;
  uVar4 = range >> 0x10 & 0xffff;
  uVar5 = (uint)range & 0xffff;
  uVar1 = (int)uVar2 * uVar5;
  uVar6 = (uint)rand_val & 0xffff;
  uVar3 = (int)uVar4 * uVar6;
  return (ulong)((uVar1 & 0xffff) + (uVar6 * uVar5 >> 0x10) + (uVar3 & 0xffff) >> 0x10) +
         (ulong)(uVar3 >> 0x10) + (ulong)(uVar1 >> 0x10) + uVar4 * uVar2;
}

Assistant:

static inline ulong rand_range(ulong rand_val, ulong range)
{
    /* calculate the high-order 32 bits of (rand_val / 2^32 * range) */
    ulong hi = (((rand_val >> 16) & 0xffff) * ((range >> 16) & 0xffff))
               + ((((rand_val >> 16) & 0xffff) * (range & 0xffff)) >> 16)
               + (((rand_val & 0xffff) * ((range >> 16) & 0xffff)) >> 16);
    
    /* calculate the low-order 32 bits */
    ulong lo = ((((rand_val >> 16) & 0xffff) * (range & 0xffff)) & 0xffff)
               + (((rand_val & 0xffff) * ((range >> 16) & 0xffff)) & 0xffff)
               + ((((rand_val & 0xffff) * (range & 0xffff)) >> 16) & 0xffff);

    /* add the carry from the low part into the high part to get the result */
    return hi + (lo >> 16);
}